

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O3

void PacketGet(void)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  char *pcVar6;
  ulong uVar7;
  in_addr *piVar8;
  ulong uVar9;
  sockaddr_in fromaddress;
  uLongf msgsize;
  socklen_t fromlen;
  FString local_48;
  undefined1 local_40 [16];
  undefined8 local_30;
  socklen_t local_24;
  
  local_24 = 0x10;
  uVar9 = 0;
  uVar2 = recvfrom(mysocket,TransmitBuffer,8000,0,(sockaddr *)local_40,&local_24);
  iVar1 = (int)uVar2;
  if (doomcom.numnodes < 1) {
LAB_004ebf2c:
    uVar7 = 0xffffffff;
    if ((uint)uVar9 != (int)doomcom.numnodes) {
      uVar7 = uVar9 & 0xffffffff;
    }
    if (iVar1 == -1 && -1 < (int)uVar7) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      if (iVar1 == 0xb) {
        doomcom.remotenode = -1;
        return;
      }
      if (iVar1 == 0x68) {
        puVar4 = (undefined8 *)
                 ((ulong)(((&DAT_00a602d8)[(ulong)sendplayer[uVar7] * 0xa8] - 1 & 0x1cf) * 0x18) +
                 (&DAT_00a602c8)[(ulong)sendplayer[uVar7] * 0x54]);
        if (StartScreen == (FStartupScreen *)0x0) {
          do {
            puVar5 = puVar4;
            puVar4 = (undefined8 *)*puVar5;
          } while (*(int *)(puVar5 + 1) != 0x1cf);
          Printf("The connection from %s was dropped.\n",*(undefined8 *)(puVar5[2] + 0x28));
        }
        else {
          do {
            puVar5 = puVar4;
            puVar4 = (undefined8 *)*puVar5;
          } while (*(int *)(puVar5 + 1) != 0x1cf);
          (*StartScreen->_vptr_FStartupScreen[7])
                    (StartScreen,"The connection from %s was dropped.\n",
                     *(undefined8 *)(puVar5[2] + 0x28));
        }
        doomcom.data[0] = 0x80;
        uVar2 = 1;
        goto LAB_004ec10a;
      }
      pcVar6 = strerror(iVar1);
      I_Error("GetPacket: %s",pcVar6);
      uVar2 = 0xffffffff;
    }
    else {
      if (iVar1 < 1 || (int)uVar7 < 0) {
        if (0 < iVar1) goto LAB_004ec04f;
        goto LAB_004ec10a;
      }
      doomcom.data[0] = TransmitBuffer[0] & 0xfb;
      if ((TransmitBuffer[0] & 4) == 0) {
        memcpy(doomcom.data + 1,TransmitBuffer + 1,(ulong)(iVar1 - 1));
      }
      else {
        local_30 = 13999;
        iVar1 = uncompress(0xa51db5,&local_30,TransmitBuffer + 1,iVar1 + -1);
        if (iVar1 != 0) {
          M_ZLibError((int)&local_48);
          Printf("Net decompression failed (zlib error %s)\n",local_48.Chars);
          FString::~FString(&local_48);
          doomcom.remotenode = -1;
          return;
        }
        uVar2 = (ulong)((int)local_30 + 1);
      }
    }
    uVar7 = uVar9 & 0xffffffff;
  }
  else {
    piVar8 = &sendaddress[0].sin_addr;
    uVar9 = 0;
    do {
      if ((local_40._4_4_ == piVar8->s_addr) &&
         (local_40._2_2_ == ((sockaddr_in *)(piVar8 + -1))->sin_port)) goto LAB_004ebf2c;
      uVar9 = uVar9 + 1;
      piVar8 = piVar8 + 4;
    } while ((uint)(int)doomcom.numnodes != uVar9);
    if (0 < iVar1) {
LAB_004ec04f:
      if (((iVar1 != 2) || (TransmitBuffer[0] != '0')) || (TransmitBuffer[1] != '\x02')) {
        pcVar6 = inet_ntoa((in_addr)local_40._4_4_);
        DPrintf(2,"Dropped packet: Unknown host (%s:%d)\n",pcVar6,(ulong)(ushort)local_40._2_2_);
      }
      doomcom.remotenode = -1;
      return;
    }
    uVar7 = 0xffffffff;
  }
LAB_004ec10a:
  doomcom.datalength = (SWORD)uVar2;
  doomcom.remotenode = (SWORD)uVar7;
  return;
}

Assistant:

void PacketGet (void)
{
	int c;
	socklen_t fromlen;
	sockaddr_in fromaddress;
	int node;

	fromlen = sizeof(fromaddress);
	c = recvfrom (mysocket, (char*)TransmitBuffer, TRANSMIT_SIZE, 0,
				  (sockaddr *)&fromaddress, &fromlen);
	node = FindNode (&fromaddress);

	if (node >= 0 && c == SOCKET_ERROR)
	{
		int err = WSAGetLastError();

		if (err == WSAECONNRESET)
		{ // The remote node aborted unexpectedly, so pretend it sent an exit packet

			if (StartScreen != NULL)
			{
				StartScreen->NetMessage ("The connection from %s was dropped.\n",
					players[sendplayer[node]].userinfo.GetName());
			}
			else
			{
				Printf("The connection from %s was dropped.\n",
					players[sendplayer[node]].userinfo.GetName());
			}

			doomcom.data[0] = 0x80;	// NCMD_EXIT
			c = 1;
		}
		else if (err != WSAEWOULDBLOCK)
		{
			I_Error ("GetPacket: %s", neterror ());
		}
		else
		{
			doomcom.remotenode = -1;		// no packet
			return;
		}
	}
	else if (node >= 0 && c > 0)
	{
		doomcom.data[0] = TransmitBuffer[0] & ~NCMD_COMPRESSED;
		if (TransmitBuffer[0] & NCMD_COMPRESSED)
		{
			uLongf msgsize = MAX_MSGLEN - 1;
			int err = uncompress(doomcom.data + 1, &msgsize, TransmitBuffer + 1, c - 1);
//			Printf("recv %d/%lu\n", c, msgsize + 1);
			if (err != Z_OK)
			{
				Printf("Net decompression failed (zlib error %s)\n", M_ZLibError(err).GetChars());
				// Pretend no packet
				doomcom.remotenode = -1;
				return;
			}
			c = msgsize + 1;
		}
		else
		{
//			Printf("recv %d\n", c);
			memcpy(doomcom.data + 1, TransmitBuffer + 1, c - 1);
		}
	}
	else if (c > 0)
	{	//The packet is not from any in-game node, so we might as well discard it.
		// Don't show the message for disconnect notifications.
		if (c != 2 || TransmitBuffer[0] != PRE_FAKE || TransmitBuffer[1] != PRE_DISCONNECT)
		{
			DPrintf(DMSG_WARNING, "Dropped packet: Unknown host (%s:%d)\n", inet_ntoa(fromaddress.sin_addr), fromaddress.sin_port);
		}
		doomcom.remotenode = -1;
		return;
	}

	doomcom.remotenode = node;
	doomcom.datalength = (short)c;
}